

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O2

ostream * operator<<(ostream *co,Vertex *v)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(co,"Vertex ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->m_id);
  std::endl<char,std::char_traits<char>>(poVar1);
  return co;
}

Assistant:

std::ostream & operator << ( std::ostream & co, const Vertex & v)
{
    co << "Vertex " << v.id() << std::endl;
    return co;
}